

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PClass::PClass(PClass *this)

{
  FName local_1c;
  
  local_1c.Index = 0;
  PNativeStruct::PNativeStruct(&this->super_PNativeStruct,&local_1c);
  (this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  super_PTypeBase.super_DObject._vptr_DObject = &PTR_StaticType_006f8050;
  (this->SpecialInits).Array = (pair<const_PType_*,_unsigned_int> *)0x0;
  (this->SpecialInits).Most = 0;
  (this->SpecialInits).Count = 0;
  (this->Virtuals).Array = (VMFunction **)0x0;
  (this->Virtuals).Most = 0;
  (this->Virtuals).Count = 0;
  *(undefined4 *)
   ((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
           super_PType.super_PTypeBase.super_DObject + 0x24) = 0x28;
  (this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  HashNext = (PType *)0x0;
  this->ConstructNative = (_func_void_void_ptr *)0x0;
  this->ParentClass = (PClass *)0x0;
  this->Pointers = (size_t *)0x0;
  this->FlatPointers = (size_t *)0x0;
  this->Defaults = (BYTE *)0x0;
  *(undefined4 *)((long)&this->Defaults + 7) = 0;
  FString::operator=(&(this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType
                      .super_PType.mDescriptiveName,"Class");
  TArray<PClass_*,_PClass_*>::Grow(&AllClasses,1);
  AllClasses.Array[AllClasses.Count] = this;
  AllClasses.Count = AllClasses.Count + 1;
  return;
}

Assistant:

PClass::PClass()
{
	Size = sizeof(DObject);
	ParentClass = nullptr;
	Pointers = nullptr;
	FlatPointers = nullptr;
	HashNext = nullptr;
	Defaults = nullptr;
	bRuntimeClass = false;
	bExported = false;
	bDecorateClass = false;
	ConstructNative = nullptr;
	mDescriptiveName = "Class";

	PClass::AllClasses.Push(this);
}